

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  result_type rVar4;
  result_type rVar5;
  double dVar6;
  bool bVar7;
  clock_t cVar8;
  ulong uVar9;
  ulong uVar10;
  ostream *poVar11;
  ulong uVar12;
  double *pdVar13;
  clock_t cVar14;
  int j_1;
  int iVar15;
  char *pcVar16;
  int j;
  ulong uVar17;
  long lVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  int local_4cc;
  undefined1 local_4c8 [16];
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> observations;
  vector<control_s,_std::allocator<control_s>_> position_meas;
  vector<ground_truth,_std::allocator<ground_truth>_> gt;
  double cum_mean_error [3];
  Map map;
  int local_3f8;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  default_random_engine gen;
  value_type local_3c8;
  vector<Particle,_std::allocator<Particle>_> particles;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> noisy_observations;
  double total_error [3];
  double sigma_pos [3];
  ParticleFilter pf;
  normal_distribution<double> local_308;
  normal_distribution<double> local_2e8;
  normal_distribution<double> local_2c8;
  normal_distribution<double> local_2a8;
  normal_distribution<double> local_288;
  double sigma_landmark [2];
  _Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_> local_258;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  _Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_> local_1c0;
  ostringstream file;
  
  cVar8 = clock();
  sigma_pos[0] = 0.3;
  sigma_pos[1] = 0.3;
  sigma_pos[2] = 0.01;
  sigma_landmark[0] = 0.3;
  sigma_landmark[1] = 0.3;
  gen._M_x = 1;
  local_288._M_param._M_mean._0_4_ = 0;
  local_288._M_param._M_mean._4_4_ = 0;
  local_288._M_param._M_stddev._0_4_ = 0x33333333;
  local_288._M_param._M_stddev._4_4_ = 0x3fd33333;
  local_288._M_saved = 0.0;
  local_2a8._M_param._M_mean._0_4_ = 0;
  local_2a8._M_param._M_mean._4_4_ = 0;
  local_2a8._M_param._M_stddev._0_4_ = 0x33333333;
  local_2a8._M_param._M_stddev._4_4_ = 0x3fd33333;
  local_2a8._M_saved = 0.0;
  local_288._M_saved_available = false;
  local_2c8._M_param._M_mean = 0.0;
  local_2c8._M_param._M_stddev = 0.01;
  local_2c8._M_saved = 0.0;
  local_2e8._M_param._M_mean._0_4_ = 0;
  local_2e8._M_param._M_mean._4_4_ = 0;
  local_2e8._M_param._M_stddev._0_4_ = 0x33333333;
  local_2e8._M_param._M_stddev._4_4_ = 0x3fd33333;
  local_2e8._M_saved = 0.0;
  local_2a8._M_saved_available = false;
  local_2c8._M_saved_available = false;
  local_2e8._M_saved_available = false;
  local_308._M_param._M_mean._0_4_ = 0;
  local_308._M_param._M_mean._4_4_ = 0;
  local_308._M_param._M_stddev._0_4_ = 0x33333333;
  local_308._M_param._M_stddev._4_4_ = 0x3fd33333;
  local_308._M_saved = 0.0;
  local_308._M_saved_available = false;
  map.landmark_list.
  super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  map.landmark_list.
  super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  map.landmark_list.
  super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_200,"data/map_data.txt",(allocator *)&file);
  bVar7 = read_map_data(&local_200,&map);
  std::__cxx11::string::~string((string *)&local_200);
  if (bVar7) {
    position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_220,"data/control_data.txt",(allocator *)&file);
    bVar7 = read_control_data(&local_220,&position_meas);
    std::__cxx11::string::~string((string *)&local_220);
    if (bVar7) {
      gt.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      gt.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      gt.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_240,"data/gt_data.txt",(allocator *)&file);
      bVar7 = read_gt_data(&local_240,&gt);
      std::__cxx11::string::~string((string *)&local_240);
      if (bVar7) {
        pf.num_particles = 0;
        uVar9 = (ulong)((long)position_meas.
                              super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4;
        pf.is_initialized = false;
        pf.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pf.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pf.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pf.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pf.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pf.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        total_error[0] = 0.0;
        total_error[1] = 0.0;
        total_error[2] = 0.0;
        cum_mean_error[0] = 0.0;
        cum_mean_error[1] = 0.0;
        cum_mean_error[2] = 0.0;
        uVar10 = uVar9 & 0xffffffff;
        if ((int)uVar9 < 1) {
          uVar10 = 0;
        }
        local_4cc = 0;
        uVar9 = 0;
        do {
          if (uVar9 == uVar10) {
            cVar14 = clock();
            std::operator<<((ostream *)&std::cout,"Runtime (sec): ");
            local_3f8 = (int)cVar8;
            dVar2 = (double)((int)cVar14 - local_3f8) / 1000000.0;
            poVar11 = std::ostream::_M_insert<double>(dVar2);
            std::endl<char,std::char_traits<char>>(poVar11);
            if (45.0 <= dVar2) {
              if ((pf.is_initialized & 1U) != 0) {
                std::operator<<((ostream *)&std::cout,"Your runtime ");
                poVar11 = std::ostream::_M_insert<double>(dVar2);
                std::operator<<(poVar11," is larger than the maximum allowable runtime, ");
                poVar11 = std::ostream::_M_insert<double>(45.0);
                std::endl<char,std::char_traits<char>>(poVar11);
                local_4cc = -1;
                break;
              }
              pcVar16 = "This is the starter code. You haven\'t initialized your filter.";
            }
            else {
              pcVar16 = "This is the starter code. You haven\'t initialized your filter.";
              if ((pf.is_initialized & 1U) != 0) {
                pcVar16 = "Success! Your particle filter passed!";
              }
            }
            poVar11 = std::operator<<((ostream *)&std::cout,pcVar16);
            local_4cc = 0;
            std::endl<char,std::char_traits<char>>(poVar11);
            break;
          }
          poVar11 = std::operator<<((ostream *)&std::cout,"Time step: ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar9);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&file);
          poVar11 = std::operator<<((ostream *)&file,"data/observation/observations_");
          poVar11 = std::operator<<(poVar11,0x30);
          *(undefined8 *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = 6;
          iVar15 = (int)(uVar9 + 1);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar15);
          std::operator<<(poVar11,".txt");
          observations.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          observations.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          observations.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::stringbuf::str();
          bVar7 = read_landmark_data(&local_1e0,&observations);
          std::__cxx11::string::~string((string *)&local_1e0);
          if (bVar7) {
            if (pf.is_initialized == false) {
              local_4c8._0_8_ = std::normal_distribution<double>::operator()(&local_288,&gen);
              std::normal_distribution<double>::operator()(&local_2a8,&gen);
              std::normal_distribution<double>::operator()(&local_2c8,&gen);
              ParticleFilter::init(&pf,(EVP_PKEY_CTX *)sigma_pos);
            }
            else {
              ParticleFilter::prediction
                        (&pf,0.1,sigma_pos,
                         position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar9 - 1].velocity,
                         position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar9 - 1].yawrate);
            }
            noisy_observations.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            noisy_observations.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            noisy_observations.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            lVar18 = 0;
            for (uVar17 = 0;
                uVar17 < (ulong)(((long)observations.
                                        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)observations.
                                       super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
                uVar17 = uVar17 + 1) {
              rVar4 = std::normal_distribution<double>::operator()(&local_2e8,&gen);
              local_4c8._8_4_ = extraout_XMM0_Dc;
              local_4c8._0_8_ = rVar4;
              local_4c8._12_4_ = extraout_XMM0_Dd;
              rVar5 = std::normal_distribution<double>::operator()(&local_308,&gen);
              puVar1 = (undefined8 *)
                       ((long)&(observations.
                                super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                                _M_impl.super__Vector_impl_data._M_start)->id + lVar18);
              local_3c8._0_8_ = *puVar1;
              local_3c8.x = rVar4 + (double)puVar1[1];
              local_3c8.y = rVar5 + *(double *)
                                     ((long)&(observations.
                                              super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->y + lVar18
                                     );
              std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back
                        ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)
                         &noisy_observations.
                          super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>,&local_3c8);
              lVar18 = lVar18 + 0x18;
            }
            std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
                      ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&local_258,
                       (vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)
                       &noisy_observations.
                        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>);
            std::vector<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::vector
                      ((vector<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_> *)
                       &local_1c0,&map.landmark_list);
            ParticleFilter::updateWeights
                      (&pf,50.0,sigma_landmark,
                       (vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&local_258,
                       (Map *)&local_1c0);
            std::_Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::
            ~_Vector_base(&local_1c0);
            std::_Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>::~_Vector_base(&local_258);
            ParticleFilter::resample(&pf);
            std::vector<Particle,_std::allocator<Particle>_>::vector(&particles,&pf.particles);
            uVar17 = ((long)particles.super__Vector_base<Particle,_std::allocator<Particle>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl
                           .super__Vector_impl_data._M_start) / 0x28;
            uVar12 = uVar17 & 0xffffffff;
            if ((int)uVar17 < 1) {
              uVar12 = 0;
            }
            uVar19 = 0;
            uVar20 = 0;
            for (lVar18 = 0; uVar12 * 0x28 - lVar18 != 0; lVar18 = lVar18 + 0x28) {
              dVar2 = *(double *)
                       ((long)&(particles.super__Vector_base<Particle,_std::allocator<Particle>_>.
                                _M_impl.super__Vector_impl_data._M_start)->weight + lVar18);
              if ((double)CONCAT44(uVar20,uVar19) <= dVar2 &&
                  dVar2 != (double)CONCAT44(uVar20,uVar19)) {
                local_3e8 = *(double *)
                             ((long)&(particles.
                                      super__Vector_base<Particle,_std::allocator<Particle>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->x + lVar18);
                local_3e0 = *(double *)
                             ((long)&(particles.
                                      super__Vector_base<Particle,_std::allocator<Particle>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->y + lVar18);
                local_3d8 = *(double *)
                             ((long)&(particles.
                                      super__Vector_base<Particle,_std::allocator<Particle>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->theta + lVar18);
                uVar19 = SUB84(dVar2,0);
                uVar20 = (int)((ulong)dVar2 >> 0x20);
              }
            }
            pdVar13 = getError(gt.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar9].x,
                               gt.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar9].y,
                               gt.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar9].theta,local_3e8,
                               local_3e0,local_3d8);
            for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
              dVar2 = pdVar13[lVar18];
              dVar3 = total_error[lVar18];
              total_error[lVar18] = dVar2 + dVar3;
              cum_mean_error[lVar18] = (dVar2 + dVar3) / (double)iVar15;
            }
            std::operator<<((ostream *)&std::cout,"Cumulative mean weighted error: x ");
            dVar2 = cum_mean_error[0];
            local_4c8._0_8_ = cum_mean_error[0];
            poVar11 = std::ostream::_M_insert<double>(cum_mean_error[0]);
            std::operator<<(poVar11," y ");
            dVar3 = cum_mean_error[1];
            poVar11 = std::ostream::_M_insert<double>(cum_mean_error[1]);
            std::operator<<(poVar11," yaw ");
            dVar6 = cum_mean_error[2];
            poVar11 = std::ostream::_M_insert<double>(cum_mean_error[2]);
            std::endl<char,std::char_traits<char>>(poVar11);
            bVar7 = true;
            if ((99 < uVar9) && (((1.0 < dVar2 || (1.0 < dVar3)) || (0.05 < dVar6)))) {
              if (dVar2 <= 1.0) {
                if (1.0 < dVar3) {
                  std::operator<<((ostream *)&std::cout,"Your y error, ");
                  local_4c8._0_8_ = dVar3;
                  goto LAB_00104bec;
                }
                std::operator<<((ostream *)&std::cout,"Your yaw error, ");
                poVar11 = std::ostream::_M_insert<double>(dVar6);
                std::operator<<(poVar11," is larger than the maximum allowable error, ");
                uVar19 = 0x9999999a;
                uVar20 = 0x3fa99999;
              }
              else {
                std::operator<<((ostream *)&std::cout,"Your x error, ");
LAB_00104bec:
                poVar11 = std::ostream::_M_insert<double>((double)local_4c8._0_8_);
                std::operator<<(poVar11," is larger than the maximum allowable error, ");
                uVar19 = 0;
                uVar20 = 0x3ff00000;
              }
              poVar11 = std::ostream::_M_insert<double>((double)CONCAT44(uVar20,uVar19));
              std::endl<char,std::char_traits<char>>(poVar11);
              bVar7 = false;
              local_4cc = -1;
            }
            std::_Vector_base<Particle,_std::allocator<Particle>_>::~_Vector_base
                      (&particles.super__Vector_base<Particle,_std::allocator<Particle>_>);
            std::_Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>::~_Vector_base
                      (&noisy_observations.
                        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>);
          }
          else {
            poVar11 = std::operator<<((ostream *)&std::cout,
                                      "Error: Could not open observation file ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar15);
            std::endl<char,std::char_traits<char>>(poVar11);
            bVar7 = false;
            local_4cc = -1;
          }
          std::_Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>::~_Vector_base
                    (&observations.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&file);
          uVar9 = uVar9 + 1;
        } while (bVar7);
        ParticleFilter::~ParticleFilter(&pf);
      }
      else {
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "Error: Could not open ground truth data file");
        std::endl<char,std::char_traits<char>>(poVar11);
        local_4cc = -1;
      }
      std::_Vector_base<ground_truth,_std::allocator<ground_truth>_>::~_Vector_base
                (&gt.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>);
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,
                                "Error: Could not open position/control measurement file");
      std::endl<char,std::char_traits<char>>(poVar11);
      local_4cc = -1;
    }
    std::_Vector_base<control_s,_std::allocator<control_s>_>::~_Vector_base
              (&position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>);
  }
  else {
    poVar11 = std::operator<<((ostream *)&std::cout,"Error: Could not open map file");
    std::endl<char,std::char_traits<char>>(poVar11);
    local_4cc = -1;
  }
  std::_Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::~_Vector_base
            ((_Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_> *)&map);
  return local_4cc;
}

Assistant:

int main() {
	
	// parameters related to grading.
	int time_steps_before_lock_required = 100; // number of time steps before accuracy is checked by grader.
	double max_runtime = 45; // Max allowable runtime to pass [sec]
	double max_translation_error = 1; // Max allowable translation error to pass [m]
	double max_yaw_error = 0.05; // Max allowable yaw error [rad]



	// Start timer.
	int start = clock();
	
	//Set up parameters here
	double delta_t = 0.1; // Time elapsed between measurements [sec]
	double sensor_range = 50; // Sensor range [m]
	
	/*
	 * Sigmas - just an estimate, usually comes from uncertainty of sensor, but
	 * if you used fused data from multiple sensors, it's difficult to find
	 * these uncertainties directly.
	 */
	double sigma_pos [3] = {0.3, 0.3, 0.01}; // GPS measurement uncertainty [x [m], y [m], theta [rad]]
	double sigma_landmark [2] = {0.3, 0.3}; // Landmark measurement uncertainty [x [m], y [m]]

	// noise generation
	default_random_engine gen;
	normal_distribution<double> N_x_init(0, sigma_pos[0]);
	normal_distribution<double> N_y_init(0, sigma_pos[1]);
	normal_distribution<double> N_theta_init(0, sigma_pos[2]);
	normal_distribution<double> N_obs_x(0, sigma_landmark[0]);
	normal_distribution<double> N_obs_y(0, sigma_landmark[1]);
	double n_x, n_y, n_theta, n_range, n_heading;
	// Read map data
	Map map;
	if (!read_map_data("data/map_data.txt", map)) {
		cout << "Error: Could not open map file" << endl;
		return -1;
	}

	// Read position data
	vector<control_s> position_meas;
	if (!read_control_data("data/control_data.txt", position_meas)) {
		cout << "Error: Could not open position/control measurement file" << endl;
		return -1;
	}
	
	// Read ground truth data
	vector<ground_truth> gt;
	if (!read_gt_data("data/gt_data.txt", gt)) {
		cout << "Error: Could not open ground truth data file" << endl;
		return -1;
	}
	
	// Run particle filter!
	int num_time_steps = position_meas.size();
	ParticleFilter pf;
	double total_error[3] = {0,0,0};
	double cum_mean_error[3] = {0,0,0};
	
	for (int i = 0; i < num_time_steps; ++i) {
		cout << "Time step: " << i << endl;
		// Read in landmark observations for current time step.
		ostringstream file;
		file << "data/observation/observations_" << setfill('0') << setw(6) << i+1 << ".txt";
		vector<LandmarkObs> observations;
		if (!read_landmark_data(file.str(), observations)) {
			cout << "Error: Could not open observation file " << i+1 << endl;
			return -1;
		}
		
		// Initialize particle filter if this is the first time step.
		if (!pf.initialized()) {
			n_x = N_x_init(gen);
			n_y = N_y_init(gen);
			n_theta = N_theta_init(gen);
			pf.init(gt[i].x + n_x, gt[i].y + n_y, gt[i].theta + n_theta, sigma_pos);
		}
		else {
			// Predict the vehicle's next state (noiseless).
			pf.prediction(delta_t, sigma_pos, position_meas[i-1].velocity, position_meas[i-1].yawrate);
		}
		// simulate the addition of noise to noiseless observation data.
		vector<LandmarkObs> noisy_observations;
		LandmarkObs obs;
		for (int j = 0; j < observations.size(); ++j) {
			n_x = N_obs_x(gen);
			n_y = N_obs_y(gen);
			obs = observations[j];
			obs.x = obs.x + n_x;
			obs.y = obs.y + n_y;
			noisy_observations.push_back(obs);
		}

		// Update the weights and resample
		pf.updateWeights(sensor_range, sigma_landmark, noisy_observations, map);
		pf.resample();
		
		// Calculate and output the average weighted error of the particle filter over all time steps so far.
		vector<Particle> particles = pf.particles;
		int num_particles = particles.size();
		double highest_weight = 0.0;
		Particle best_particle;
		for (int i = 0; i < num_particles; ++i) {
			if (particles[i].weight > highest_weight) {
				highest_weight = particles[i].weight;
				best_particle = particles[i];
			}
		}
		double *avg_error = getError(gt[i].x, gt[i].y, gt[i].theta, best_particle.x, best_particle.y, best_particle.theta);

		for (int j = 0; j < 3; ++j) {
			total_error[j] += avg_error[j];
			cum_mean_error[j] = total_error[j] / (double)(i + 1);
		}
		
		// Print the cumulative weighted error
		cout << "Cumulative mean weighted error: x " << cum_mean_error[0] << " y " << cum_mean_error[1] << " yaw " << cum_mean_error[2] << endl;
		
		// If the error is too high, say so and then exit.
		if (i >= time_steps_before_lock_required) {
			if (cum_mean_error[0] > max_translation_error || cum_mean_error[1] > max_translation_error || cum_mean_error[2] > max_yaw_error) {
				if (cum_mean_error[0] > max_translation_error) {
					cout << "Your x error, " << cum_mean_error[0] << " is larger than the maximum allowable error, " << max_translation_error << endl;
				}
				else if (cum_mean_error[1] > max_translation_error) {
					cout << "Your y error, " << cum_mean_error[1] << " is larger than the maximum allowable error, " << max_translation_error << endl;
				}
				else {
					cout << "Your yaw error, " << cum_mean_error[2] << " is larger than the maximum allowable error, " << max_yaw_error << endl;
				}
				return -1;
			}
		}
	}
	
	// Output the runtime for the filter.
	int stop = clock();
	double runtime = (stop - start) / double(CLOCKS_PER_SEC);
	cout << "Runtime (sec): " << runtime << endl;
	
	// Print success if accuracy and runtime are sufficient (and this isn't just the starter code).
	if (runtime < max_runtime && pf.initialized()) {
		cout << "Success! Your particle filter passed!" << endl;
	}
	else if (!pf.initialized()) {
		cout << "This is the starter code. You haven't initialized your filter." << endl;
	}
	else {
		cout << "Your runtime " << runtime << " is larger than the maximum allowable runtime, " << max_runtime << endl;
		return -1;
	}
	
	return 0;
}